

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

Subpalette * __thiscall sfc::Palette::add_subpalette(Palette *this)

{
  uint uVar1;
  size_type sVar2;
  runtime_error *this_00;
  reference pvVar3;
  Subpalette *sp;
  Palette *local_10;
  Palette *this_local;
  
  uVar1 = this->_max_subpalettes;
  local_10 = this;
  sVar2 = std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::size(&this->_subpalettes);
  if (uVar1 == sVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Colors don\'t fit in palette");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Subpalette::Subpalette((Subpalette *)&sp,this->_mode,this->_max_colors_per_subpalette);
  std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::emplace_back<sfc::Subpalette>
            (&this->_subpalettes,(Subpalette *)&sp);
  Subpalette::~Subpalette((Subpalette *)&sp);
  pvVar3 = std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::back(&this->_subpalettes)
  ;
  return pvVar3;
}

Assistant:

Subpalette& Palette::add_subpalette() {
  if (_max_subpalettes - _subpalettes.size() == 0)
    throw std::runtime_error("Colors don't fit in palette");
  _subpalettes.emplace_back(Subpalette(_mode, _max_colors_per_subpalette));
  Subpalette& sp = _subpalettes.back();
  return sp;
}